

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMulti.c
# Opt level: O1

int Abc_NtkMultiLimit_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vCone,int nFaninMax,int fCanStop,int fFirst)

{
  uint uVar1;
  int *piVar2;
  bool bVar3;
  int iVar4;
  void **ppvVar5;
  void *pvVar6;
  uint uVar7;
  long lVar8;
  int unaff_R12D;
  int iVar9;
  
  bVar3 = false;
  while( true ) {
    if (((ulong)pNode & 1) != 0) {
      __assert_fail("!Abc_ObjIsComplement(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                    ,0x130,"int Abc_NtkMultiLimit_rec(Abc_Obj_t *, Vec_Ptr_t *, int, int, int)");
    }
    if ((fFirst == 0) && ((*(uint *)&pNode->field_0x14 & 0x1f) != 7)) break;
    if (fCanStop != 0) {
      if (vCone->nSize != 0) {
        __assert_fail("vCone->nSize == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                      ,0x13f,"int Abc_NtkMultiLimit_rec(Abc_Obj_t *, Vec_Ptr_t *, int, int, int)");
      }
      iVar9 = 1;
      iVar4 = Abc_NtkMultiLimit_rec
                        ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray],vCone,
                         nFaninMax,1,0);
      if (iVar4 == 0) {
        iVar4 = vCone->nSize;
        if (nFaninMax < iVar4) {
          __assert_fail("nNodes0 <= nFaninMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                        ,0x144,"int Abc_NtkMultiLimit_rec(Abc_Obj_t *, Vec_Ptr_t *, int, int, int)")
          ;
        }
        iVar9 = 0;
        Abc_NtkMultiLimit_rec
                  ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]],vCone,
                   nFaninMax,0,0);
        if (nFaninMax < vCone->nSize) {
          vCone->nSize = 0;
          Abc_NtkMultiLimit_rec
                    ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]],vCone,
                     nFaninMax,0,0);
          if (nFaninMax < vCone->nSize) {
            vCone->nSize = 0;
            iVar9 = 1;
            iVar4 = Abc_NtkMultiLimit_rec
                              ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]],
                               vCone,nFaninMax,1,0);
            if (iVar4 == 0) {
              __assert_fail("RetValue == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                            ,0x154,
                            "int Abc_NtkMultiLimit_rec(Abc_Obj_t *, Vec_Ptr_t *, int, int, int)");
            }
          }
          else {
            piVar2 = (pNode->vFanins).pArray;
            ppvVar5 = pNode->pNtk->vObjs->pArray;
            if (iVar4 < vCone->nSize) {
              pvVar6 = ppvVar5[piVar2[1]];
              uVar7 = *(uint *)((long)pvVar6 + 0x14);
              if ((uVar7 & 0x10) != 0) {
                __assert_fail("Abc_ObjFanin(pNode,1)->fMarkA == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                              ,0x161,
                              "int Abc_NtkMultiLimit_rec(Abc_Obj_t *, Vec_Ptr_t *, int, int, int)");
              }
            }
            else {
              pvVar6 = ppvVar5[*piVar2];
              uVar7 = *(uint *)((long)pvVar6 + 0x14);
              if ((uVar7 & 0x10) != 0) {
                __assert_fail("Abc_ObjFanin(pNode,0)->fMarkA == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                              ,0x15c,
                              "int Abc_NtkMultiLimit_rec(Abc_Obj_t *, Vec_Ptr_t *, int, int, int)");
              }
            }
            *(uint *)((long)pvVar6 + 0x14) = uVar7 | 0x10;
            iVar9 = 1;
          }
        }
      }
      goto LAB_002d7fb9;
    }
    fCanStop = 0;
    Abc_NtkMultiLimit_rec
              ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray],vCone,nFaninMax,0,0
              );
    pNode = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]];
    if (!bVar3) {
      unaff_R12D = 0;
    }
    bVar3 = true;
    fFirst = 0;
  }
  uVar7 = vCone->nSize;
  if ((long)(int)uVar7 < 1) goto LAB_002d7eca;
  iVar9 = 0;
  lVar8 = 0;
  do {
    if ((Abc_Obj_t *)vCone->pArray[lVar8] == pNode) goto LAB_002d7fb9;
    lVar8 = lVar8 + 1;
  } while ((int)uVar7 != lVar8);
LAB_002d7eca:
  uVar1 = vCone->nCap;
  if (uVar7 == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vCone->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(vCone->pArray,0x80);
      }
      vCone->pArray = ppvVar5;
      iVar9 = 0x10;
    }
    else {
      iVar9 = uVar1 * 2;
      if (iVar9 <= (int)uVar1) goto LAB_002d7fa4;
      if (vCone->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(vCone->pArray,(ulong)uVar1 << 4);
      }
      vCone->pArray = ppvVar5;
    }
    vCone->nCap = iVar9;
  }
LAB_002d7fa4:
  iVar9 = vCone->nSize;
  vCone->nSize = iVar9 + 1;
  vCone->pArray[iVar9] = pNode;
  iVar9 = 0;
LAB_002d7fb9:
  if (bVar3) {
    iVar9 = unaff_R12D;
  }
  return iVar9;
}

Assistant:

int Abc_NtkMultiLimit_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vCone, int nFaninMax, int fCanStop, int fFirst )
{
    int nNodes0, nNodes1;
    assert( !Abc_ObjIsComplement(pNode) );
    // check if the node should be added to the fanins
    if ( !fFirst && (pNode->fMarkA || !Abc_ObjIsNode(pNode)) )
    {
        Vec_PtrPushUnique( vCone, pNode );
        return 0;
    }
    // if we cannot stop in this branch, collect all nodes
    if ( !fCanStop )
    {
        Abc_NtkMultiLimit_rec( Abc_ObjFanin(pNode,0), vCone, nFaninMax, 0, 0 );
        Abc_NtkMultiLimit_rec( Abc_ObjFanin(pNode,1), vCone, nFaninMax, 0, 0 );
        return 0;
    }
    // if we can stop, try the left branch first, and return if we stopped
    assert( vCone->nSize == 0 );
    if ( Abc_NtkMultiLimit_rec( Abc_ObjFanin(pNode,0), vCone, nFaninMax, 1, 0 ) )
        return 1;
    // save the number of nodes in the left branch and call for the right branch
    nNodes0 = vCone->nSize;
    assert( nNodes0 <= nFaninMax );
    Abc_NtkMultiLimit_rec( Abc_ObjFanin(pNode,1), vCone, nFaninMax, 0, 0 );
    // check the number of nodes
    if ( vCone->nSize <= nFaninMax )
        return 0;
    // the number of nodes exceeds the limit

    // get the number of nodes in the right branch
    vCone->nSize = 0;
    Abc_NtkMultiLimit_rec( Abc_ObjFanin(pNode,1), vCone, nFaninMax, 0, 0 );
    // if this number exceeds the limit, solve the problem for this branch
    if ( vCone->nSize > nFaninMax )
    {
        int RetValue;
        vCone->nSize = 0;
        RetValue = Abc_NtkMultiLimit_rec( Abc_ObjFanin(pNode,1), vCone, nFaninMax, 1, 0 );
        assert( RetValue == 1 );
        return 1;
    }

    nNodes1 = vCone->nSize; 
    assert( nNodes1 <= nFaninMax );
    if ( nNodes0 >= nNodes1 )
    { // the left branch is larger - cut it
        assert( Abc_ObjFanin(pNode,0)->fMarkA == 0 );
        Abc_ObjFanin(pNode,0)->fMarkA = 1;
    }
    else
    { // the right branch is larger - cut it
        assert( Abc_ObjFanin(pNode,1)->fMarkA == 0 );
        Abc_ObjFanin(pNode,1)->fMarkA = 1;
    }
    return 1;
}